

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

bool Js::JavascriptLibrary::InitializeSetPrototype
               (DynamicObject *setPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  bool bVar1;
  ScriptContext *this;
  JavascriptLibrary *this_00;
  RuntimeFunction **ppRVar2;
  JavascriptFunction *value;
  ScriptConfiguration *this_01;
  JavascriptString *value_00;
  JavascriptFunction *valuesFunc;
  JavascriptLibrary *library;
  ScriptContext *scriptContext;
  DeferredInitializeMode mode_local;
  DeferredTypeHandlerBase *typeHandler_local;
  DynamicObject *setPrototype_local;
  
  DeferredTypeHandlerBase::Convert(typeHandler,setPrototype,mode,0xc,1);
  this = RecyclableObject::GetScriptContext(&setPrototype->super_RecyclableObject);
  this_00 = RecyclableObject::GetLibrary(&setPrototype->super_RecyclableObject);
  ppRVar2 = Memory::WriteBarrierPtr::operator_cast_to_RuntimeFunction__
                      ((WriteBarrierPtr *)&(this_00->super_JavascriptLibraryBase).setConstructor);
  AddMember(this_00,setPrototype,0x67,*ppRVar2);
  AddFunctionToLibraryObject
            (this_00,setPrototype,0x4a,(FunctionInfo *)JavascriptSet::EntryInfo::Add,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,setPrototype,0x62,(FunctionInfo *)JavascriptSet::EntryInfo::Clear,0,'\x06');
  AddFunctionToLibraryObject
            (this_00,setPrototype,0x6f,(FunctionInfo *)JavascriptSet::EntryInfo::Delete,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,setPrototype,0x93,(FunctionInfo *)JavascriptSet::EntryInfo::ForEach,1,'\x06');
  AddFunctionToLibraryObject
            (this_00,setPrototype,0xb4,(FunctionInfo *)JavascriptSet::EntryInfo::Has,1,'\x06');
  AddAccessorsToLibraryObject
            (this_00,setPrototype,0x14f,(FunctionInfo *)JavascriptSet::EntryInfo::SizeGetter,
             (FunctionInfo *)0x0);
  AddFunctionToLibraryObject
            (this_00,setPrototype,0x7a,(FunctionInfo *)JavascriptSet::EntryInfo::Entries,0,'\x06');
  value = AddFunctionToLibraryObject
                    (this_00,setPrototype,399,(FunctionInfo *)JavascriptSet::EntryInfo::Values,0,
                     '\x06');
  AddMember(this_00,setPrototype,0xcf,value);
  AddMember(this_00,setPrototype,0x14,value);
  this_01 = ScriptContext::GetConfig(this);
  bVar1 = ScriptConfiguration::IsES6ToStringTagEnabled(this_01);
  if (bVar1) {
    value_00 = CreateStringFromCppLiteral<4ul>(this_00,(char16 (*) [4])0x19899bc);
    AddMember(this_00,setPrototype,0x1b,value_00,'\x02');
  }
  DynamicObject::SetHasNoEnumerableProperties(setPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSetPrototype(DynamicObject* setPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(setPrototype, mode, 12, true);
        // Note: Any new function addition/deletion/modification should also be updated in JavascriptLibrary::ProfilerRegisterSet
        // so that the update is in sync with profiler
        ScriptContext* scriptContext = setPrototype->GetScriptContext();
        JavascriptLibrary* library = setPrototype->GetLibrary();
        library->AddMember(setPrototype, PropertyIds::constructor, library->setConstructor);

        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::add, &JavascriptSet::EntryInfo::Add, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::clear, &JavascriptSet::EntryInfo::Clear, 0);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::delete_, &JavascriptSet::EntryInfo::Delete, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::forEach, &JavascriptSet::EntryInfo::ForEach, 1);
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::has, &JavascriptSet::EntryInfo::Has, 1);

        library->AddAccessorsToLibraryObject(setPrototype, PropertyIds::size, &JavascriptSet::EntryInfo::SizeGetter, nullptr);

        JavascriptFunction* valuesFunc;
        library->AddFunctionToLibraryObject(setPrototype, PropertyIds::entries, &JavascriptSet::EntryInfo::Entries, 0);
        valuesFunc = library->AddFunctionToLibraryObject(setPrototype, PropertyIds::values, &JavascriptSet::EntryInfo::Values, 0);
        library->AddMember(setPrototype, PropertyIds::keys, valuesFunc);
        library->AddMember(setPrototype, PropertyIds::_symbolIterator, valuesFunc);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(setPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("Set")), PropertyConfigurable);
        }

        setPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }